

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_image.h
# Opt level: O2

string * TextureImage::Texture::testAllSuffix(string *__return_storage_ptr__,string *no_suffix_name)

{
  FILE *__stream;
  long lVar1;
  allocator<char> local_ac;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  string support_suffix [4];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)support_suffix,".bmp",&local_a9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(support_suffix + 1),".jpg",&local_aa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(support_suffix + 2),".png",&local_ab);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(support_suffix + 3),".tga",&local_ac);
  lVar1 = 0;
  do {
    if (lVar1 == 0x80) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00127ed2:
      lVar1 = 0x60;
      do {
        std::__cxx11::string::~string((string *)((long)&support_suffix[0]._M_dataplus._M_p + lVar1))
        ;
        lVar1 = lVar1 + -0x20;
      } while (lVar1 != -0x20);
      return __return_storage_ptr__;
    }
    std::operator+(__return_storage_ptr__,no_suffix_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&support_suffix[0]._M_dataplus._M_p + lVar1));
    __stream = fopen((__return_storage_ptr__->_M_dataplus)._M_p,"r");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      goto LAB_00127ed2;
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    lVar1 = lVar1 + 0x20;
  } while( true );
}

Assistant:

static std::string testAllSuffix(std::string no_suffix_name) {
            const int support_suffix_num = 4;
            const std::string support_suffix[support_suffix_num] = {
                    ".bmp",
                    ".jpg",
                    ".png",
                    ".tga"
            };

            for (int i = 0; i < support_suffix_num; i++) {
                std::string try_filename = no_suffix_name + support_suffix[i];
                FILE *ftest = fopen(try_filename.c_str(), "r");
                if (ftest) {
                    fclose(ftest);
                    return try_filename;
                }
            }
            return std::string();
        }